

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backed_block.cpp
# Opt level: O1

int queue_bb(backed_block_list *bbl,backed_block *new_bb)

{
  uint in_EAX;
  int iVar1;
  backed_block *pbVar2;
  backed_block *pbVar3;
  
  pbVar3 = bbl->data_blocks;
  if (pbVar3 != (backed_block *)0x0) {
    in_EAX = new_bb->block;
    if (pbVar3->block <= in_EAX) {
      pbVar2 = bbl->last_used;
      if ((pbVar2 == (backed_block *)0x0) || (in_EAX <= pbVar2->block)) {
        pbVar2 = pbVar3;
      }
      bbl->last_used = new_bb;
      do {
        pbVar3 = pbVar2;
        pbVar2 = pbVar3->next;
        if (pbVar2 == (backed_block *)0x0) goto LAB_001039fb;
      } while (pbVar2->block < in_EAX);
      if (pbVar2 != (backed_block *)0x0) {
        new_bb->next = pbVar2;
      }
LAB_001039fb:
      pbVar3->next = new_bb;
      merge_bb(bbl,new_bb,new_bb->next);
      iVar1 = merge_bb(bbl,pbVar3,new_bb);
      if (iVar1 != 0) {
        return iVar1;
      }
      bbl->last_used = pbVar3;
      return 0;
    }
    new_bb->next = pbVar3;
  }
  bbl->data_blocks = new_bb;
  return in_EAX;
}

Assistant:

static int queue_bb(struct backed_block_list* bbl, struct backed_block* new_bb) {
  struct backed_block* bb;

  if (bbl->data_blocks == nullptr) {
    bbl->data_blocks = new_bb;
    return 0;
  }

  if (bbl->data_blocks->block > new_bb->block) {
    new_bb->next = bbl->data_blocks;
    bbl->data_blocks = new_bb;
    return 0;
  }

  /* Optimization: blocks are mostly queued in sequence, so save the
     pointer to the last bb that was added, and start searching from
     there if the next block number is higher */
  if (bbl->last_used && new_bb->block > bbl->last_used->block)
    bb = bbl->last_used;
  else
    bb = bbl->data_blocks;
  bbl->last_used = new_bb;

  for (; bb->next && bb->next->block < new_bb->block; bb = bb->next)
    ;

  if (bb->next == nullptr) {
    bb->next = new_bb;
  } else {
    new_bb->next = bb->next;
    bb->next = new_bb;
  }

  merge_bb(bbl, new_bb, new_bb->next);
  if (!merge_bb(bbl, bb, new_bb)) {
    /* new_bb destroyed, point to retained as last_used */
    bbl->last_used = bb;
  }

  return 0;
}